

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O0

void test_case_unsigned_mul(zt_unit_test *test,void *data)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  zt_unit_test *in_RDI;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  
  uVar1 = zt_uchar_mul('\x01',0xff);
  if (uVar1 != 0xff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_mul(1, UCHAR_MAX) == UCHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x14d);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_mul(0xff,'\x01');
  if (uVar1 != 0xff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_mul(UCHAR_MAX, 1) == UCHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x14e);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_mul('\x01','\0');
  if (uVar1 != '\0') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_mul(1, UCHAR_MIN) == UCHAR_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x150);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_mul('\0','\x01');
  if (uVar1 != '\0') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_mul(UCHAR_MIN, 1) == UCHAR_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x151);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_mul('\x02','\x7f');
  if (uVar1 != 0xfe) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_uchar_mul(2, UCHAR_MAX / 2) == UCHAR_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x153);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_mul('\x7f','\x02');
  if (uVar1 != 0xfe) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_uchar_mul(UCHAR_MAX / 2, 2) == UCHAR_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x154);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_mul(1,0xffff);
  if (uVar2 != 0xffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_mul(1, USHORT_MAX) == USHORT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x15d);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_mul(0xffff,1);
  if (uVar2 != 0xffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_mul(USHORT_MAX, 1) == USHORT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x15e);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_mul(1,0);
  if (uVar2 != 0) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_mul(1, USHORT_MIN) == USHORT_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x160);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_mul(0,1);
  if (uVar2 != 0) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_mul(USHORT_MIN, 1) == USHORT_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x161);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_mul(2,0x7fff);
  if (uVar2 != 0xfffe) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_ushort_mul(2, USHORT_MAX / 2) == USHORT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x163);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_mul(0x7fff,2);
  if (uVar2 != 0xfffe) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_ushort_mul(USHORT_MAX / 2, 2) == USHORT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x164);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_mul(1,0xffffffff);
  if (uVar3 != 0xffffffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_mul(1, UINT_MAX) == UINT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x16d);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_mul(0xffffffff,1);
  if (uVar3 != 0xffffffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_mul(UINT_MAX, 1) == UINT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x16e);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_mul(1,0);
  if (uVar3 != 0) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_mul(1, UINT_MIN) == UINT_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x170);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_mul(0,1);
  if (uVar3 == 0) {
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_mul(2,0x7fffffff);
    if (uVar3 != 0xfffffffe) {
      iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_uint_mul(2, UINT_MAX / 2) == UINT_MAX - 1",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x173);
      if (iVar4 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_mul(0x7fffffff,2);
    if (uVar3 == 0xfffffffe) {
      zt_unit_test_add_assertion(in_RDI);
      return;
    }
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_uint_mul(UINT_MAX / 2, 2) == UINT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x174);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_mul(UINT_MIN, 1) == UINT_MIN",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                         ,0x171);
  if (iVar4 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
test_case_unsigned_mul(struct zt_unit_test *test, void *data UNUSED)
{
    /* unsigned multiplication */
    /* char */
    ZT_UNIT_ASSERT(test, zt_uchar_mul(1, UCHAR_MAX) == UCHAR_MAX);
    ZT_UNIT_ASSERT(test, zt_uchar_mul(UCHAR_MAX, 1) == UCHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_uchar_mul(1, UCHAR_MIN) == UCHAR_MIN);
    ZT_UNIT_ASSERT(test, zt_uchar_mul(UCHAR_MIN, 1) == UCHAR_MIN);

    ZT_UNIT_ASSERT(test, zt_uchar_mul(2, UCHAR_MAX / 2) == UCHAR_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_uchar_mul(UCHAR_MAX / 2, 2) == UCHAR_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(2, UCHAR_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(UCHAR_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(2, UCHAR_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_mul(UCHAR_MAX / 2 + 1, 2)); */

    /* short */
    ZT_UNIT_ASSERT(test, zt_ushort_mul(1, USHORT_MAX) == USHORT_MAX);
    ZT_UNIT_ASSERT(test, zt_ushort_mul(USHORT_MAX, 1) == USHORT_MAX);

    ZT_UNIT_ASSERT(test, zt_ushort_mul(1, USHORT_MIN) == USHORT_MIN);
    ZT_UNIT_ASSERT(test, zt_ushort_mul(USHORT_MIN, 1) == USHORT_MIN);

    ZT_UNIT_ASSERT(test, zt_ushort_mul(2, USHORT_MAX / 2) == USHORT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_ushort_mul(USHORT_MAX / 2, 2) == USHORT_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(2, USHORT_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(USHORT_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(2, USHORT_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_mul(USHORT_MAX / 2 + 1, 2)); */

    /* int */
    ZT_UNIT_ASSERT(test, zt_uint_mul(1, UINT_MAX) == UINT_MAX);
    ZT_UNIT_ASSERT(test, zt_uint_mul(UINT_MAX, 1) == UINT_MAX);

    ZT_UNIT_ASSERT(test, zt_uint_mul(1, UINT_MIN) == UINT_MIN);
    ZT_UNIT_ASSERT(test, zt_uint_mul(UINT_MIN, 1) == UINT_MIN);

    ZT_UNIT_ASSERT(test, zt_uint_mul(2, UINT_MAX / 2) == UINT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_uint_mul(UINT_MAX / 2, 2) == UINT_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(2, UINT_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(UINT_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(2, UINT_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_mul(UINT_MAX / 2 + 1, 2)); */

# ifndef __x86_64__
    /* long */
    ZT_UNIT_ASSERT(test, zt_ulong_mul(1, ULONG_MAX) == ULONG_MAX);
    ZT_UNIT_ASSERT(test, zt_ulong_mul(ULONG_MAX, 1) == ULONG_MAX);

    ZT_UNIT_ASSERT(test, zt_ulong_mul(1, ULONG_MIN) == ULONG_MIN);
    ZT_UNIT_ASSERT(test, zt_ulong_mul(ULONG_MIN, 1) == ULONG_MIN);

    ZT_UNIT_ASSERT(test, zt_ulong_mul(2, ULONG_MAX / 2) == ULONG_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_ulong_mul(ULONG_MAX / 2, 2) == ULONG_MAX - 1);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(2, ULONG_MAX)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(ULONG_MAX, 2)); */

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(2, ULONG_MAX / 2 + 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_mul(ULONG_MAX / 2 + 1, 2)); */
# endif /* ifndef __x86_64__ */
}